

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O1

llama_ubatch * __thiscall
llama_sbatch::split_seq(llama_ubatch *__return_storage_ptr__,llama_sbatch *this,size_t n_ubatch)

{
  pointer plVar1;
  
  if (this->n_tokens < n_ubatch) {
    n_ubatch = this->n_tokens;
  }
  reserve_ubatch(__return_storage_ptr__,this,n_ubatch,this->batch->embd != (float *)0x0);
  plVar1 = (this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->seq).super__Vector_base<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>._M_impl.
      super__Vector_impl_data._M_start != plVar1) {
    if (plVar1[-1].n_seq_id < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                 ,0xba,"GGML_ASSERT(%s) failed","s.n_seq_id > 0");
    }
    if (plVar1[-1].length < n_ubatch) {
      n_ubatch = plVar1[-1].length;
    }
    add_seq_to_ubatch(this,__return_storage_ptr__,plVar1 + -1,n_ubatch);
  }
  return __return_storage_ptr__;
}

Assistant:

llama_ubatch llama_sbatch::split_seq(size_t n_ubatch) {
    n_ubatch = n_tokens < n_ubatch ? n_tokens : n_ubatch;
    llama_ubatch ubatch = reserve_ubatch(n_ubatch, /* has_embd */ batch->embd != nullptr);
    if (!seq.empty()) {
        llama_sbatch_seq & s = seq[seq.size() - 1];
        size_t length = s.length < n_ubatch ? s.length : n_ubatch;
        GGML_ASSERT(s.n_seq_id > 0); // should not be mixed with simple splits
        add_seq_to_ubatch(ubatch, s, length);
    }
    return ubatch;
}